

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_move.c
# Opt level: O1

int move_field(FIELD *field,int frow,int fcol)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((-1 < (fcol | frow) && field != (FIELD *)0x0) && (iVar2 = -4, field->form == (formnode *)0x0))
  {
    field->frow = (short)frow;
    field->fcol = (short)fcol;
    iVar2 = 0;
  }
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  return iVar2;
}

Assistant:

int move_field(FIELD *field, int frow, int fcol)
{
  if ( !field || (frow<0) || (fcol<0) ) 
    RETURN(E_BAD_ARGUMENT);

  if (field->form) 
    RETURN(E_CONNECTED);

  field->frow = frow;
  field->fcol = fcol;
  RETURN(E_OK);
}